

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

bool tinyxml2::XMLUtil::ToBool(char *str,bool *value)

{
  bool bVar1;
  uint in_EAX;
  bool bVar2;
  int ival;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  bVar1 = ToInt(str,(int *)((long)&uStack_18 + 4));
  if (bVar1) {
    bVar2 = uStack_18._4_4_ != 0;
  }
  else {
    bVar1 = StringEqual(str,"true",0x7fffffff);
    bVar2 = true;
    if (!bVar1) {
      bVar1 = StringEqual(str,"false",0x7fffffff);
      bVar2 = false;
      if (!bVar1) {
        return false;
      }
    }
  }
  *value = bVar2;
  return true;
}

Assistant:

bool XMLUtil::ToBool( const char* str, bool* value )
{
    int ival = 0;
    if ( ToInt( str, &ival )) {
        *value = (ival==0) ? false : true;
        return true;
    }
    if ( StringEqual( str, "true" ) ) {
        *value = true;
        return true;
    }
    else if ( StringEqual( str, "false" ) ) {
        *value = false;
        return true;
    }
    return false;
}